

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# header_detection.cpp
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true> *
__thiscall
duckdb::CSVSniffer::DetectHeaderInternal_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
           *__return_storage_ptr__,CSVSniffer *this,ClientContext *context,
          vector<duckdb::HeaderValue,_true> *best_header_row,CSVStateMachine *state_machine,
          SetColumns *set_columns,
          unordered_map<unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>_>
          *best_sql_types_candidates_per_column_idx,CSVReaderOptions *options,
          MultiFileOptions *file_options,CSVErrorHandler *error_handler)

{
  idx_t *piVar1;
  string *col_name;
  char cVar2;
  element_type *peVar3;
  element_type *peVar4;
  StateMachine *pSVar5;
  unsigned_long uVar6;
  idx_t total_cols;
  byte bVar7;
  bool bVar8;
  KeywordCategory KVar9;
  DialectOptions *type;
  mapped_type *this_00;
  reference this_01;
  long lVar10;
  ulong uVar11;
  reference pvVar12;
  reference pvVar13;
  utf8proc_uint8_t *puVar14;
  size_t sVar15;
  iterator iVar16;
  mapped_type *pmVar17;
  InternalException *this_02;
  idx_t col;
  pointer pHVar18;
  byte bVar19;
  ulong uVar20;
  size_type __n;
  byte bVar21;
  idx_t i;
  pointer total_cols_00;
  byte bVar22;
  string_t value;
  string col_name_nfkd;
  string col_name_trimmed;
  string col_name_ascii;
  anon_union_16_2_67f50693_for_value local_110;
  CSVError error;
  string local_70;
  string local_50;
  
  (__return_storage_ptr__->
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  total_cols_00 = (pointer)set_columns[1].names;
  best_header_row[5].super_vector<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_>.
  super__Vector_base<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_>._M_impl.
  super__Vector_impl_data._M_finish = total_cols_00;
  peVar3 = (context->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
           super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar4 = (element_type *)
           (context->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
           super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (peVar3 == peVar4) {
    *(undefined2 *)
     &best_header_row[5].super_vector<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_>.
      super__Vector_base<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = 0;
    for (pHVar18 = (pointer)0x0; pHVar18 < total_cols_00; pHVar18 = (pointer)&pHVar18->field_0x1) {
      ::std::__cxx11::string::string((string *)&col_name_nfkd,"column",(allocator *)&col_name_ascii)
      ;
      GenerateColumnName(&error.error_message,(idx_t)total_cols_00,(idx_t)pHVar18,&col_name_nfkd);
      ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 __return_storage_ptr__,&error.error_message);
      ::std::__cxx11::string::~string((string *)&error);
      ::std::__cxx11::string::~string((string *)&col_name_nfkd);
      total_cols_00 = (pointer)(((CSVStateMachine *)best_header_row)->dialect_options).num_cols;
    }
LAB_019a2b60:
    ReplaceNames(__return_storage_ptr__,(CSVStateMachine *)best_header_row,
                 (unordered_map<unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>_>
                  *)set_columns,(CSVReaderOptions *)best_sql_types_candidates_per_column_idx,
                 (MultiFileOptions *)options,(vector<duckdb::HeaderValue,_true> *)context,
                 (CSVErrorHandler *)file_options);
  }
  else {
    if ((*(char *)&best_sql_types_candidates_per_column_idx[0xc]._M_h._M_rehash_policy.
                   _M_max_load_factor == '\0') &&
       (total_cols_00 != (pointer)(((long)peVar4 - (long)peVar3) / 0x28))) {
      if (*(char *)((long)&best_sql_types_candidates_per_column_idx[2]._M_h._M_rehash_policy.
                           _M_max_load_factor + 1) == '\x01') {
        *(undefined2 *)
         &best_header_row[5].super_vector<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_>
          .super__Vector_base<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = 0;
        for (pHVar18 = (pointer)0x0; pHVar18 < total_cols_00; pHVar18 = (pointer)&pHVar18->field_0x1
            ) {
          ::std::__cxx11::string::string
                    ((string *)&col_name_nfkd,"column",(allocator *)&col_name_ascii);
          GenerateColumnName(&error.error_message,(idx_t)total_cols_00,(idx_t)pHVar18,&col_name_nfkd
                            );
          ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     __return_storage_ptr__,&error.error_message);
          ::std::__cxx11::string::~string((string *)&error);
          ::std::__cxx11::string::~string((string *)&col_name_nfkd);
          total_cols_00 = (pointer)(((CSVStateMachine *)best_header_row)->dialect_options).num_cols;
        }
        piVar1 = &(((CSVStateMachine *)best_header_row)->dialect_options).rows_until_header;
        *piVar1 = *piVar1 + 1;
        goto LAB_019a2b60;
      }
      CSVError::HeaderSniffingError
                (&error,(CSVReaderOptions *)best_sql_types_candidates_per_column_idx,
                 (vector<duckdb::HeaderValue,_true> *)context,(idx_t)total_cols_00,
                 (string *)
                 &best_header_row[3].
                  super_vector<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_>.
                  super__Vector_base<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_>.
                  _M_impl.super__Vector_impl_data._M_finish);
      CSVErrorHandler::Error((CSVErrorHandler *)file_options,&error,false);
      CSVError::~CSVError(&error);
    }
    pSVar5 = state_machine->transition_array;
    if ((pSVar5 == (StateMachine *)0x0) ||
       (*(long *)pSVar5->state_machine[0] == *(long *)(pSVar5->state_machine[0] + 8))) {
      type = &((CSVStateMachine *)best_header_row)->dialect_options;
      bVar7 = 1;
      bVar22 = 1;
      col_name_nfkd._M_dataplus._M_p = (pointer)0x0;
      bVar19 = 1;
      bVar21 = 1;
      while( true ) {
        if ((pointer)(((long)(context->super_enable_shared_from_this<duckdb::ClientContext>).
                             __weak_this_.internal.
                             super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi -
                      (long)(context->super_enable_shared_from_this<duckdb::ClientContext>).
                            __weak_this_.internal.
                            super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr) / 0x28) <= col_name_nfkd._M_dataplus._M_p) break;
        pvVar12 = vector<duckdb::HeaderValue,_true>::get<true>
                            ((vector<duckdb::HeaderValue,_true> *)context,
                             (size_type)col_name_nfkd._M_dataplus._M_p);
        bVar21 = bVar21 & pvVar12->is_null;
        this_00 = ::std::__detail::
                  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)set_columns,(key_type *)&col_name_nfkd);
        this_01 = vector<duckdb::LogicalType,_true>::back(this_00);
        LogicalType::LogicalType((LogicalType *)&error,VARCHAR);
        bVar8 = LogicalType::operator!=(this_01,(LogicalType *)&error);
        LogicalType::~LogicalType((LogicalType *)&error);
        if (bVar8) {
          pvVar12 = vector<duckdb::HeaderValue,_true>::get<true>
                              ((vector<duckdb::HeaderValue,_true> *)context,
                               (size_type)col_name_nfkd._M_dataplus._M_p);
          string_t::string_t((string_t *)&local_110.pointer,&pvVar12->value);
          pvVar12 = vector<duckdb::HeaderValue,_true>::get<true>
                              ((vector<duckdb::HeaderValue,_true> *)context,
                               (size_type)col_name_nfkd._M_dataplus._M_p);
          value.value.pointer.ptr = (char *)this_01;
          value.value._0_8_ = local_110.pointer.ptr;
          bVar8 = CanYouCastIt(this,(ClientContext *)local_110._0_8_,value,(LogicalType *)type,
                               (DialectOptions *)(ulong)pvVar12->is_null,
                               *(bool *)best_sql_types_candidates_per_column_idx[0xc]._M_h.
                                        _M_buckets,(char)best_header_row);
          bVar19 = 0;
          bVar22 = bVar7;
          if (!bVar8) {
            bVar22 = bVar19;
            bVar7 = 0;
          }
        }
        col_name_nfkd._M_dataplus._M_p = col_name_nfkd._M_dataplus._M_p + 1;
      }
      bVar7 = true;
      if (bVar19 == 0 && bVar21 == 0) {
        bVar7 = bVar22 ^ 1;
      }
    }
    else {
      bVar7 = DetectHeaderWithSetColumn
                        ((ClientContext *)this,(vector<duckdb::HeaderValue,_true> *)context,
                         (SetColumns *)state_machine,
                         (CSVReaderOptions *)best_sql_types_candidates_per_column_idx);
    }
    if ((char)best_sql_types_candidates_per_column_idx[1]._M_h._M_bucket_count != '\0') {
      bVar7 = *(byte *)((long)&best_sql_types_candidates_per_column_idx[1]._M_h._M_bucket_count + 1)
      ;
    }
    if ((bVar7 & 1) == 0) {
      (((CSVStateMachine *)best_header_row)->dialect_options).header.set_by_user = false;
      (((CSVStateMachine *)best_header_row)->dialect_options).header.value = false;
      for (uVar11 = 0; uVar20 = (((CSVStateMachine *)best_header_row)->dialect_options).num_cols,
          uVar11 < uVar20; uVar11 = uVar11 + 1) {
        ::std::__cxx11::string::string
                  ((string *)&col_name_nfkd,"column",(allocator *)&col_name_ascii);
        GenerateColumnName(&error.error_message,uVar20,uVar11,&col_name_nfkd);
        ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   __return_storage_ptr__,&error.error_message);
        ::std::__cxx11::string::~string((string *)&error);
        ::std::__cxx11::string::~string((string *)&col_name_nfkd);
      }
    }
    else {
      (((CSVStateMachine *)best_header_row)->dialect_options).header.set_by_user = false;
      (((CSVStateMachine *)best_header_row)->dialect_options).header.value = true;
      if (((*(char *)&best_sql_types_candidates_per_column_idx[0xc]._M_h._M_rehash_policy.
                      _M_max_load_factor == '\x01') &&
          ((char)best_sql_types_candidates_per_column_idx[2]._M_h._M_bucket_count == '\0')) &&
         (uVar6 = (((CSVStateMachine *)best_header_row)->dialect_options).skip_rows.value,
         uVar6 != 0)) {
        (((CSVStateMachine *)best_header_row)->dialect_options).skip_rows.set_by_user = false;
        (((CSVStateMachine *)best_header_row)->dialect_options).skip_rows.value = uVar6 - 1;
      }
      error.error_message._M_dataplus._M_p = (pointer)&error.full_error_message.field_2;
      error.error_message._M_string_length = 1;
      error.error_message.field_2._M_allocated_capacity = 0;
      error.error_message.field_2._8_8_ = 0;
      error.full_error_message._M_dataplus._M_p._0_4_ = 0x3f800000;
      error.full_error_message._M_string_length = 0;
      error.full_error_message.field_2._M_allocated_capacity = 0;
      __n = 0;
      while( true ) {
        lVar10 = (long)(context->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.
                       internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi -
                 (long)(context->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.
                       internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr;
        uVar11 = lVar10 / 0x28;
        if (uVar11 <= __n) break;
        pvVar12 = vector<duckdb::HeaderValue,_true>::get<true>
                            ((vector<duckdb::HeaderValue,_true> *)context,__n);
        pvVar13 = vector<duckdb::HeaderValue,_true>::get<true>
                            ((vector<duckdb::HeaderValue,_true> *)context,__n);
        col_name = &pvVar12->value;
        bVar22 = *(byte *)&best_sql_types_candidates_per_column_idx[9]._M_h._M_buckets;
        bVar8 = EmptyHeader(col_name,pvVar13->is_null,(bool)bVar22);
        if (bVar8) {
          total_cols = (((CSVStateMachine *)best_header_row)->dialect_options).num_cols;
          ::std::__cxx11::string::string
                    ((string *)&col_name_ascii,"column",(allocator *)&col_name_trimmed);
          GenerateColumnName(&col_name_nfkd,total_cols,__n,&col_name_ascii);
          ::std::__cxx11::string::operator=((string *)col_name,(string *)&col_name_nfkd);
          ::std::__cxx11::string::~string((string *)&col_name_nfkd);
          ::std::__cxx11::string::~string((string *)&col_name_ascii);
          bVar22 = *(byte *)&best_sql_types_candidates_per_column_idx[9]._M_h._M_buckets;
        }
        if ((bVar22 & 1) == 0) {
          TrimWhitespace(&col_name_nfkd,col_name);
          ::std::__cxx11::string::operator=((string *)col_name,(string *)&col_name_nfkd);
          ::std::__cxx11::string::~string((string *)&col_name_nfkd);
        }
        else {
          puVar14 = (utf8proc_uint8_t *)(pvVar12->value)._M_dataplus._M_p;
          lVar10 = NumericCastImpl<long,_unsigned_long,_false>::Convert
                             ((pvVar12->value)._M_string_length);
          puVar14 = utf8proc_NFKD(puVar14,lVar10);
          sVar15 = strlen((char *)puVar14);
          col_name_nfkd._M_dataplus._M_p = (pointer)&col_name_nfkd.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&col_name_nfkd,puVar14,puVar14 + sVar15);
          free(puVar14);
          ::std::__cxx11::string::string
                    ((string *)&col_name_ascii,anon_var_dwarf_4b0ffdd + 9,
                     (allocator *)&col_name_trimmed);
          for (uVar11 = 0; uVar11 < col_name_nfkd._M_string_length; uVar11 = uVar11 + 1) {
            bVar22 = col_name_nfkd._M_dataplus._M_p[uVar11];
            if ((bVar22 == 0x5f) ||
               (('/' < (char)bVar22 &&
                ((bVar22 < 0x3a ||
                 ((0x40 < bVar22 && ((byte)(bVar22 + 0x9f) < 0x1a || bVar22 < 0x5b)))))))) {
              ::std::__cxx11::string::push_back((char)&col_name_ascii);
            }
            else if ((bVar22 < 0x21) && ((0x100003e00U >> ((ulong)bVar22 & 0x3f) & 1) != 0)) {
              ::std::__cxx11::string::append((char *)&col_name_ascii);
            }
          }
          TrimWhitespace(&col_name_trimmed,&col_name_ascii);
          ::std::__cxx11::string::string
                    ((string *)&local_70,anon_var_dwarf_4b0ffdd + 9,(allocator *)&local_50);
          bVar8 = false;
          for (uVar11 = 0; uVar11 < col_name_trimmed._M_string_length; uVar11 = uVar11 + 1) {
            cVar2 = col_name_trimmed._M_dataplus._M_p[uVar11];
            if (cVar2 == ' ') {
              if (!bVar8) {
                ::std::__cxx11::string::append((char *)&local_70);
              }
            }
            else {
              ::std::__cxx11::string::push_back((char)&local_70);
            }
            bVar8 = cVar2 == ' ';
          }
          if (local_70._M_string_length == 0) {
            ::std::__cxx11::string::assign((char *)&local_70);
          }
          else {
            StringUtil::Lower(&local_50,&local_70);
            ::std::__cxx11::string::operator=((string *)&local_70,(string *)&local_50);
            ::std::__cxx11::string::~string((string *)&local_50);
          }
          KVar9 = KeywordHelper::KeywordCategoryType(&local_70);
          if ((KVar9 < KEYWORD_COL_NAME) || ((byte)(*local_70._M_dataplus._M_p - 0x30U) < 10)) {
            ::std::operator+(&local_50,"_",&local_70);
            ::std::__cxx11::string::operator=((string *)&local_70,(string *)&local_50);
            ::std::__cxx11::string::~string((string *)&local_50);
          }
          ::std::__cxx11::string::~string((string *)&col_name_trimmed);
          ::std::__cxx11::string::~string((string *)&col_name_ascii);
          ::std::__cxx11::string::~string((string *)&col_name_nfkd);
          ::std::__cxx11::string::operator=((string *)col_name,(string *)&local_70);
          ::std::__cxx11::string::~string((string *)&local_70);
        }
        while( true ) {
          iVar16 = ::std::
                   _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                           *)&error,col_name);
          if (iVar16.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
              ._M_cur == (__node_type *)0x0) break;
          pmVar17 = ::std::__detail::
                    _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)&error,col_name);
          *pmVar17 = *pmVar17 + 1;
          ::std::operator+(&col_name_ascii,col_name,"_");
          pmVar17 = ::std::__detail::
                    _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)&error,col_name);
          ::std::__cxx11::to_string(&col_name_trimmed,*pmVar17);
          ::std::operator+(&col_name_nfkd,&col_name_ascii,&col_name_trimmed);
          ::std::__cxx11::string::operator=((string *)col_name,(string *)&col_name_nfkd);
          ::std::__cxx11::string::~string((string *)&col_name_nfkd);
          ::std::__cxx11::string::~string((string *)&col_name_trimmed);
          ::std::__cxx11::string::~string((string *)&col_name_ascii);
        }
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)__return_storage_ptr__,col_name);
        pmVar17 = ::std::__detail::
                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)&error,col_name);
        *pmVar17 = 0;
        __n = __n + 1;
      }
      uVar20 = (((CSVStateMachine *)best_header_row)->dialect_options).num_cols;
      if (uVar11 < uVar20) {
        if (*(char *)&best_sql_types_candidates_per_column_idx[0xc]._M_h._M_rehash_policy.
                      _M_max_load_factor != '\x01') {
          this_02 = (InternalException *)__cxa_allocate_exception(0x10,__n,lVar10 % 0x28);
          ::std::__cxx11::string::string
                    ((string *)&col_name_nfkd,
                     "Detected header has number of columns inferior to dialect detection",
                     (allocator *)&col_name_ascii);
          InternalException::InternalException(this_02,&col_name_nfkd);
          __cxa_throw(this_02,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        }
        for (; uVar11 < uVar20; uVar11 = uVar11 + 1) {
          ::std::__cxx11::string::string
                    ((string *)&col_name_ascii,"column",(allocator *)&col_name_trimmed);
          GenerateColumnName(&col_name_nfkd,uVar20,uVar11,&col_name_ascii);
          ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     __return_storage_ptr__,&col_name_nfkd);
          ::std::__cxx11::string::~string((string *)&col_name_nfkd);
          ::std::__cxx11::string::~string((string *)&col_name_ascii);
          uVar20 = (((CSVStateMachine *)best_header_row)->dialect_options).num_cols;
        }
      }
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)&error);
    }
    ReplaceNames(__return_storage_ptr__,(CSVStateMachine *)best_header_row,
                 (unordered_map<unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>_>
                  *)set_columns,(CSVReaderOptions *)best_sql_types_candidates_per_column_idx,
                 (MultiFileOptions *)options,(vector<duckdb::HeaderValue,_true> *)context,
                 (CSVErrorHandler *)file_options);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<string> CSVSniffer::DetectHeaderInternal(
    ClientContext &context, vector<HeaderValue> &best_header_row, CSVStateMachine &state_machine,
    const SetColumns &set_columns, unordered_map<idx_t, vector<LogicalType>> &best_sql_types_candidates_per_column_idx,
    CSVReaderOptions &options, const MultiFileOptions &file_options, CSVErrorHandler &error_handler) {
	vector<string> detected_names;
	auto &dialect_options = state_machine.dialect_options;
	dialect_options.num_cols = best_sql_types_candidates_per_column_idx.size();
	if (best_header_row.empty()) {
		dialect_options.header = false;
		for (idx_t col = 0; col < dialect_options.num_cols; col++) {
			detected_names.push_back(GenerateColumnName(dialect_options.num_cols, col));
		}
		// If the user provided names, we must replace our header with the user provided names
		ReplaceNames(detected_names, state_machine, best_sql_types_candidates_per_column_idx, options, file_options,
		             best_header_row, error_handler);
		return detected_names;
	}
	// information for header detection
	// check if header row is all null and/or consistent with detected column data types
	// If null-padding is not allowed and there is a mismatch between our header candidate and the number of columns
	// We can't detect the dialect/type options properly
	if (!options.null_padding && best_sql_types_candidates_per_column_idx.size() != best_header_row.size()) {
		if (options.ignore_errors.GetValue()) {
			dialect_options.header = false;
			for (idx_t col = 0; col < dialect_options.num_cols; col++) {
				detected_names.push_back(GenerateColumnName(dialect_options.num_cols, col));
			}
			dialect_options.rows_until_header += 1;
			ReplaceNames(detected_names, state_machine, best_sql_types_candidates_per_column_idx, options, file_options,
			             best_header_row, error_handler);
			return detected_names;
		}
		auto error =
		    CSVError::HeaderSniffingError(options, best_header_row, best_sql_types_candidates_per_column_idx.size(),
		                                  state_machine.dialect_options.state_machine_options.delimiter.GetValue());
		error_handler.Error(error);
	}
	bool has_header;

	if (set_columns.IsSet()) {
		has_header = DetectHeaderWithSetColumn(context, best_header_row, set_columns, options);
	} else {
		bool first_row_consistent = true;
		bool all_varchar = true;
		bool first_row_nulls = true;
		for (idx_t col = 0; col < best_header_row.size(); col++) {
			if (!best_header_row[col].IsNull()) {
				first_row_nulls = false;
			}
			// try cast to sql_type of column
			const auto &sql_type = best_sql_types_candidates_per_column_idx[col].back();
			if (sql_type != LogicalType::VARCHAR) {
				all_varchar = false;
				if (!CanYouCastIt(context, best_header_row[col].value, sql_type, dialect_options,
				                  best_header_row[col].IsNull(), options.decimal_separator[0])) {
					first_row_consistent = false;
				}
			}
		}
		// Our header is only false if types are not all varchar, and rows are consistent
		if (all_varchar || first_row_nulls) {
			has_header = true;
		} else {
			has_header = !first_row_consistent;
		}
	}

	if (options.dialect_options.header.IsSetByUser()) {
		// Header is defined by user, use that.
		has_header = options.dialect_options.header.GetValue();
	}
	// update parser info, and read, generate & set col_names based on previous findings
	if (has_header) {
		dialect_options.header = true;
		if (options.null_padding && !options.dialect_options.skip_rows.IsSetByUser()) {
			if (dialect_options.skip_rows.GetValue() > 0) {
				dialect_options.skip_rows = dialect_options.skip_rows.GetValue() - 1;
			}
		}
		case_insensitive_map_t<idx_t> name_collision_count;

		// get header names from CSV
		for (idx_t col = 0; col < best_header_row.size(); col++) {
			string &col_name = best_header_row[col].value;

			// generate name if field is empty
			if (EmptyHeader(col_name, best_header_row[col].is_null, options.normalize_names)) {
				col_name = GenerateColumnName(dialect_options.num_cols, col);
			}

			// normalize names or at least trim whitespace
			if (options.normalize_names) {
				col_name = NormalizeColumnName(col_name);
			} else {
				col_name = TrimWhitespace(col_name);
			}

			// avoid duplicate header names
			while (name_collision_count.find(col_name) != name_collision_count.end()) {
				name_collision_count[col_name] += 1;
				col_name = col_name + "_" + to_string(name_collision_count[col_name]);
			}
			detected_names.push_back(col_name);
			name_collision_count[col_name] = 0;
		}
		if (best_header_row.size() < dialect_options.num_cols && options.null_padding) {
			for (idx_t col = best_header_row.size(); col < dialect_options.num_cols; col++) {
				detected_names.push_back(GenerateColumnName(dialect_options.num_cols, col));
			}
		} else if (best_header_row.size() < dialect_options.num_cols) {
			throw InternalException("Detected header has number of columns inferior to dialect detection");
		}

	} else {
		dialect_options.header = false;
		for (idx_t col = 0; col < dialect_options.num_cols; col++) {
			detected_names.push_back(GenerateColumnName(dialect_options.num_cols, col));
		}
	}

	// If the user provided names, we must replace our header with the user provided names
	ReplaceNames(detected_names, state_machine, best_sql_types_candidates_per_column_idx, options, file_options,
	             best_header_row, error_handler);
	return detected_names;
}